

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O2

void __thiscall PointIncrement::test_method(PointIncrement *this)

{
  Matrix<double,_3,_1,_0,_3,_1> local_268;
  RealScalar local_250;
  undefined1 local_248;
  undefined8 local_240;
  shared_count sStack_238;
  undefined **local_230;
  undefined1 local_228;
  undefined8 *local_220;
  char **local_218;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_208;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  RealSpace R3;
  Point x;
  
  mnf::RealSpace::RealSpace(&R3,3);
  local_268.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_268.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       2.0;
  local_268.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       3.0;
  mnf::Manifold::getZero();
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,3,1,0,3,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_230,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_268,(type *)0x0);
  mnf::Point::increment((Ref *)&x);
  free(local_218);
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x38);
  mnf::SubPoint::value();
  local_250 = 1e-12;
  local_248 = Eigen::internal::
              isApprox_selector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_false>
              ::run(&local_268,&local_208,&local_250);
  local_240 = 0;
  sStack_238.pi_ = (sp_counted_base *)0x0;
  local_218 = &local_1e0;
  local_1e0 = "v.isApprox(x.value())";
  local_1d8 = "";
  local_228 = 0;
  local_230 = &PTR__lazy_ostream_0013ec40;
  local_220 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_1e8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_238);
  mnf::Point::~Point(&x);
  mnf::RealSpace::~RealSpace(&R3);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointIncrement)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);
  Point x = R3.getZero();
  x.increment(v);
  BOOST_CHECK(v.isApprox(x.value()));
}